

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall MeshLib::List<char>::Append(List<char> *this,char *t)

{
  ListNode<char> *this_00;
  ListNode<char> *h;
  char *t_local;
  List<char> *this_local;
  
  this_00 = (ListNode<char> *)operator_new(0x10);
  ListNode<char>::ListNode(this_00,t);
  append(this,this_00);
  return;
}

Assistant:

void List<T>::Append( T * t )
{
	ListNode<T> * h = m_head;

	h = new ListNode<T>(t);
	
	append( h );
	return;

}